

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O0

string * __thiscall pstack::Dwarf::DIE::name_abi_cxx11_(string *__return_storage_ptr__,DIE *this)

{
  bool bVar1;
  allocator<char> local_55 [13];
  undefined1 local_48 [8];
  Attribute attr;
  DIE *this_local;
  
  attr.formp = (FormEntry *)this;
  attribute((Attribute *)local_48,this,DW_AT_name,false);
  bVar1 = Attribute::valid((Attribute *)local_48);
  if (bVar1) {
    Attribute::operator_cast_to_string(__return_storage_ptr__,(Attribute *)local_48);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_55)
    ;
    std::allocator<char>::~allocator(local_55);
  }
  Attribute::~Attribute((Attribute *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
DIE::name() const
{
    auto attr = attribute(DW_AT_name);
    return attr.valid() ? std::string(attr) : "";
}